

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O0

double __thiscall S1Interval::Project(S1Interval *this,double p)

{
  double dVar1;
  double dVar2;
  S1Interval *a;
  bool bVar3;
  ostream *poVar4;
  S1Interval *local_c0;
  double dhi;
  double dlo;
  S2LogMessage local_60;
  S2LogMessageVoidify local_4d [20];
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  S1Interval *local_20;
  double p_local;
  S1Interval *this_local;
  
  local_20 = (S1Interval *)p;
  p_local = (double)this;
  bVar3 = is_empty(this);
  local_39 = 0;
  if (bVar3) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0xba,kFatal,(ostream *)&std::cerr);
    local_39 = 1;
    poVar4 = S2LogMessage::stream(&local_38);
    poVar4 = std::operator<<(poVar4,"Check failed: !is_empty() ");
    S2LogMessageVoidify::operator&(&local_21,poVar4);
  }
  if ((local_39 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  if (3.141592653589793 < ABS((double)local_20)) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0xbb,kFatal,(ostream *)&std::cerr);
    poVar4 = S2LogMessage::stream(&local_60);
    poVar4 = std::operator<<(poVar4,"Check failed: (fabs(p)) <= (3.14159265358979323846) ");
    S2LogMessageVoidify::operator&(local_4d,poVar4);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
  }
  if (((double)local_20 == -3.141592653589793) && (!NAN((double)local_20))) {
    local_20 = (S1Interval *)0x400921fb54442d18;
  }
  bVar3 = FastContains(this,(double)local_20);
  a = local_20;
  if (bVar3) {
    this_local = local_20;
  }
  else {
    dVar1 = lo(this);
    dVar1 = PositiveDistance((double)a,dVar1);
    dVar2 = hi(this);
    dVar2 = PositiveDistance(dVar2,(double)local_20);
    if (dVar2 <= dVar1) {
      local_c0 = (S1Interval *)hi(this);
    }
    else {
      local_c0 = (S1Interval *)lo(this);
    }
    this_local = local_c0;
  }
  return (double)this_local;
}

Assistant:

double S1Interval::Project(double p) const {
  S2_DCHECK(!is_empty());
  S2_DCHECK_LE(fabs(p), M_PI);
  if (p == -M_PI) p = M_PI;
  if (FastContains(p)) return p;
  // Compute distance from p to each endpoint.
  double dlo = PositiveDistance(p, lo());
  double dhi = PositiveDistance(hi(), p);
  return (dlo < dhi) ? lo() : hi();
}